

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void indexedY_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t address_00;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  undefined8 in_RDI;
  m680x_info *unaff_retaddr;
  uint8_t offset;
  uint8_t local_19 [14];
  
  local_19[0] = '\0';
  address_00 = *in_RDX;
  *in_RDX = address_00 + 1;
  read_byte(in_RSI,local_19,address_00);
  add_indexed_operand(unaff_retaddr,(m680x_reg)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),(uint8_t)((ulong)in_RDI >> 0x10),
                      (uint8_t)((ulong)in_RDI >> 8),(uint16_t)((ulong)in_RSI >> 0x30),
                      SUB81((ulong)in_RSI >> 0x28,0));
  return;
}

Assistant:

static void indexedY_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint8_t offset = 0;

	read_byte(info, &offset, (*address)++);

	add_indexed_operand(info, M680X_REG_Y, false, 0, M680X_OFFSET_BITS_8,
		(uint16_t)offset, false);
}